

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O3

void __thiscall
HashtableAllTest_ConstLocalIterators_Test<google::HashtableInterface_SparseHashSet<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_ConstLocalIterators_Test<google::HashtableInterface_SparseHashSet<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  HashtableInterface_SparseHashSet<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *pHVar1;
  long lVar2;
  sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *this_00;
  const_local_iterator *pcVar3;
  undefined8 *puVar4;
  char *in_R9;
  ulong i;
  byte bVar5;
  pair<unsigned_long,_unsigned_long> pVar6;
  pair<google::sparse_hashtable_const_iterator<int,_int,_Hasher,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_bool>
  r;
  AssertHelper local_210;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_208;
  internal local_200 [8];
  undefined8 *local_1f8;
  const_nonempty_iterator local_1f0;
  string local_1e8;
  HashtableInterface_SparseHashSet<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *local_1c8;
  undefined1 local_1c0 [80];
  const_local_iterator local_170;
  HashtableInterface_SparseHashSet<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *local_128;
  const_local_iterator local_120;
  HashtableInterface_SparseHashSet<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *local_d8;
  const_local_iterator local_d0;
  HashtableInterface_SparseHashSet<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *local_88;
  const_local_iterator local_80;
  HashtableInterface_SparseHashSet<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *local_38;
  
  bVar5 = 0;
  pHVar1 = &(this->
            super_HashtableAllTest<google::HashtableInterface_SparseHashSet<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            ).
            super_HashtableTest<google::HashtableInterface_SparseHashSet<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            .ht_;
  local_1e8._M_dataplus._M_p._0_4_ = UniqueObjectHelper<int>(1);
  this_00 = &(this->
             super_HashtableAllTest<google::HashtableInterface_SparseHashSet<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ).
             super_HashtableTest<google::HashtableInterface_SparseHashSet<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             .ht_.
             super_BaseHashtableInterface<google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             .ht_;
  google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::
  insert((pair<google::sparse_hashtable_const_iterator<int,_int,_Hasher,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_bool>
          *)local_1c0,this_00,(value_type *)&local_1e8);
  local_1c0._0_4_ = UniqueObjectHelper<int>(1);
  pVar6 = google::
          sparse_hashtable<int,_int,_Hasher,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          ::find_position<int>(&this_00->rep,(int *)local_1c0);
  i = pVar6.second;
  if (pVar6.first != 0xffffffffffffffff) {
    i = pVar6.first;
  }
  google::
  sparse_hashtable<int,_int,_Hasher,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::begin(&local_80,&this_00->rep,i);
  local_38 = pHVar1;
  pcVar3 = &local_80;
  puVar4 = (undefined8 *)local_1c0;
  for (lVar2 = 9; lVar2 != 0; lVar2 = lVar2 + -1) {
    *puVar4 = pcVar3->ht;
    pcVar3 = (const_local_iterator *)((long)pcVar3 + (ulong)bVar5 * -0x10 + 8);
    puVar4 = puVar4 + (ulong)bVar5 * -2 + 1;
  }
  local_1c0._72_8_ = pHVar1;
  google::
  sparse_hashtable<int,_int,_Hasher,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::end(&local_d0,&this_00->rep,i);
  local_1f0 = local_d0.pos.col_current;
  local_1c8 = pHVar1;
  local_88 = pHVar1;
  if ((((sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
        local_1c0._8_8_ == local_d0.pos.row_begin._M_current) &&
      ((sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
       local_1c0._16_8_ == local_d0.pos.row_end._M_current)) &&
     ((sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
      local_1c0._24_8_ == local_d0.pos.row_current._M_current)) {
    if (local_d0.pos.row_current._M_current == local_d0.pos.row_end._M_current) {
      local_200[0] = (internal)0x0;
    }
    else {
      local_200[0] = (internal)
                     ((const_nonempty_iterator)local_1c0._32_8_ != local_d0.pos.col_current);
      local_1f8 = (undefined8 *)0x0;
      if ((bool)local_200[0]) goto LAB_0068f97c;
    }
    local_1f8 = (undefined8 *)0x0;
    testing::Message::Message((Message *)&local_208);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1e8,local_200,(AssertionResult *)"b != e","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_210,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,300,(char *)CONCAT44(local_1e8._M_dataplus._M_p._4_4_,
                                     (int)local_1e8._M_dataplus._M_p));
    testing::internal::AssertHelper::operator=(&local_210,(Message *)&local_208);
    testing::internal::AssertHelper::~AssertHelper(&local_210);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_1e8._M_dataplus._M_p._4_4_,(int)local_1e8._M_dataplus._M_p) !=
        &local_1e8.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_1e8._M_dataplus._M_p._4_4_,(int)local_1e8._M_dataplus._M_p));
    }
    if (local_208._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_208._M_head_impl + 8))();
    }
    puVar4 = local_1f8;
    if (local_1f8 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_1f8 != local_1f8 + 2) {
        operator_delete((undefined8 *)*local_1f8);
      }
      operator_delete(puVar4);
    }
  }
LAB_0068f97c:
  google::
  sparse_hashtable_const_iterator<int,_int,_Hasher,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::operator++((sparse_hashtable_const_iterator<int,_int,_Hasher,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                *)local_1c0);
  if ((((sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
        local_1c0._8_8_ == local_d0.pos.row_begin._M_current) &&
      ((sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
       local_1c0._16_8_ == local_d0.pos.row_end._M_current)) &&
     ((sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
      local_1c0._24_8_ == local_d0.pos.row_current._M_current)) {
    if (local_d0.pos.row_current._M_current == local_d0.pos.row_end._M_current) goto LAB_0068fa80;
    local_200[0] = (internal)((const_nonempty_iterator)local_1c0._32_8_ == local_1f0);
    local_1f8 = (undefined8 *)0x0;
    if ((bool)local_200[0]) goto LAB_0068fa80;
  }
  else {
    local_200[0] = (internal)0x0;
  }
  local_1f8 = (undefined8 *)0x0;
  testing::Message::Message((Message *)&local_208);
  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
            (&local_1e8,local_200,(AssertionResult *)"b == e","false","true",in_R9);
  testing::internal::AssertHelper::AssertHelper
            (&local_210,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
             ,0x12e,(char *)CONCAT44(local_1e8._M_dataplus._M_p._4_4_,
                                     (int)local_1e8._M_dataplus._M_p));
  testing::internal::AssertHelper::operator=(&local_210,(Message *)&local_208);
  testing::internal::AssertHelper::~AssertHelper(&local_210);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_1e8._M_dataplus._M_p._4_4_,(int)local_1e8._M_dataplus._M_p) !=
      &local_1e8.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_1e8._M_dataplus._M_p._4_4_,(int)local_1e8._M_dataplus._M_p));
  }
  if (local_208._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_208._M_head_impl + 8))();
  }
  puVar4 = local_1f8;
  if (local_1f8 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_1f8 != local_1f8 + 2) {
      operator_delete((undefined8 *)*local_1f8);
    }
    operator_delete(puVar4);
  }
LAB_0068fa80:
  google::
  sparse_hashtable<int,_int,_Hasher,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::begin(&local_120,&this_00->rep,i ^ 1);
  pHVar1 = local_1c8;
  local_d8 = local_1c8;
  local_1f0 = local_120.pos.col_current;
  google::
  sparse_hashtable<int,_int,_Hasher,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::end(&local_170,&this_00->rep,i ^ 1);
  local_128 = pHVar1;
  if (((local_120.pos.row_begin._M_current == local_170.pos.row_begin._M_current) &&
      (local_120.pos.row_end._M_current == local_170.pos.row_end._M_current)) &&
     (local_120.pos.row_current._M_current == local_170.pos.row_current._M_current)) {
    if (local_120.pos.row_current._M_current == local_120.pos.row_end._M_current) {
      return;
    }
    local_200[0] = (internal)(local_1f0 == local_170.pos.col_current);
    if ((bool)local_200[0]) {
      return;
    }
  }
  else {
    local_200[0] = (internal)0x0;
  }
  local_1f8 = (undefined8 *)0x0;
  testing::Message::Message((Message *)&local_208);
  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
            (&local_1e8,local_200,(AssertionResult *)"b2 == e2","false","true",in_R9);
  testing::internal::AssertHelper::AssertHelper
            (&local_210,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
             ,0x131,(char *)CONCAT44(local_1e8._M_dataplus._M_p._4_4_,
                                     (int)local_1e8._M_dataplus._M_p));
  testing::internal::AssertHelper::operator=(&local_210,(Message *)&local_208);
  testing::internal::AssertHelper::~AssertHelper(&local_210);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_1e8._M_dataplus._M_p._4_4_,(int)local_1e8._M_dataplus._M_p) !=
      &local_1e8.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_1e8._M_dataplus._M_p._4_4_,(int)local_1e8._M_dataplus._M_p));
  }
  if (local_208._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_208._M_head_impl + 8))();
  }
  puVar4 = local_1f8;
  if (local_1f8 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_1f8 != local_1f8 + 2) {
      operator_delete((undefined8 *)*local_1f8);
    }
    operator_delete(puVar4);
  }
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, ConstLocalIterators) {
  this->ht_.insert(this->UniqueObject(1));
  const typename TypeParam::size_type bucknum =
      this->ht_.bucket(this->UniqueKey(1));
  typename TypeParam::const_local_iterator b = this->ht_.begin(bucknum);
  typename TypeParam::const_local_iterator e = this->ht_.end(bucknum);
  EXPECT_TRUE(b != e);
  b++;
  EXPECT_TRUE(b == e);
  typename TypeParam::const_local_iterator b2 = this->ht_.begin(bucknum ^ 1);
  typename TypeParam::const_local_iterator e2 = this->ht_.end(bucknum ^ 1);
  EXPECT_TRUE(b2 == e2);
}